

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O1

void __thiscall
chrono::ChFrameMoving<double>::TransformParentToLocal
          (ChFrameMoving<double> *this,ChFrameMoving<double> *parent,ChFrameMoving<double> *local)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  ChVector<double> local_50;
  ChCoordsys<double> *local_38;
  
  ChFrame<double>::TransformParentToLocal
            (&this->super_ChFrame<double>,&parent->super_ChFrame<double>,
             &local->super_ChFrame<double>);
  local_38 = &(parent->super_ChFrame<double>).coord;
  PointSpeedParentToLocal(&local_50,this,&local_38->pos,&(parent->coord_dt).pos);
  if ((ChCoordsys<double> *)&local_50 != &local->coord_dt) {
    (local->coord_dt).pos.m_data[0] = local_50.m_data[0];
    (local->coord_dt).pos.m_data[1] = local_50.m_data[1];
    (local->coord_dt).pos.m_data[2] = local_50.m_data[2];
  }
  PointAccelerationParentToLocal
            (&local_50,this,&local_38->pos,&(parent->coord_dt).pos,&(parent->coord_dtdt).pos);
  if ((ChCoordsys<double> *)&local_50 != &local->coord_dtdt) {
    (local->coord_dtdt).pos.m_data[0] = local_50.m_data[0];
    (local->coord_dtdt).pos.m_data[1] = local_50.m_data[1];
    (local->coord_dtdt).pos.m_data[2] = local_50.m_data[2];
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[0];
  dVar1 = (this->super_ChFrame<double>).coord.rot.m_data[1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1;
  dVar2 = (this->coord_dt).rot.m_data[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = (local->super_ChFrame<double>).coord.rot.m_data[3];
  dVar3 = (this->coord_dt).rot.m_data[3];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar3;
  dVar4 = (local->super_ChFrame<double>).coord.rot.m_data[0];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar4;
  dVar5 = (local->super_ChFrame<double>).coord.rot.m_data[1];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar5;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = (this->coord_dt).rot.m_data[0];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = (local->super_ChFrame<double>).coord.rot.m_data[2];
  dVar6 = (this->coord_dt).rot.m_data[2];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar6;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar6 * dVar4;
  auVar15 = vfmadd231sd_fma(auVar40,auVar32,auVar36);
  auVar15 = vfmadd231sd_fma(auVar15,auVar25,auVar28);
  auVar15 = vfnmadd231sd_fma(auVar15,auVar16,auVar22);
  dVar7 = (parent->coord_dt).rot.m_data[2] - auVar15._0_8_;
  dVar6 = (this->super_ChFrame<double>).coord.rot.m_data[2];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar6;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar4 * dVar2;
  auVar15 = vfmadd231sd_fma(auVar50,auVar32,auVar28);
  auVar15 = vfnmadd231sd_fma(auVar15,auVar25,auVar36);
  auVar15 = vfmadd231sd_fma(auVar15,auVar38,auVar22);
  dVar8 = (parent->coord_dt).rot.m_data[1] - auVar15._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar4 * dVar3;
  auVar15 = vfmadd231sd_fma(auVar54,auVar32,auVar22);
  auVar15 = vfnmadd231sd_fma(auVar15,auVar38,auVar28);
  auVar15 = vfmadd231sd_fma(auVar15,auVar16,auVar36);
  dVar3 = (parent->coord_dt).rot.m_data[3] - auVar15._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar5 * dVar2;
  auVar15 = vfmsub231sd_fma(auVar10,auVar17,auVar32);
  auVar15 = vfnmadd231sd_fma(auVar15,auVar38,auVar36);
  auVar15 = vfnmadd231sd_fma(auVar15,auVar25,auVar22);
  dVar5 = (parent->coord_dt).rot.m_data[0] - auVar15._0_8_;
  dVar2 = (this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar2;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar2 * dVar5;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar3;
  auVar15 = vfmsub231sd_fma(auVar15,auVar11,auVar51);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar8;
  auVar15 = vfmadd231sd_fma(auVar15,auVar45,auVar47);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar7;
  auVar16 = vfnmadd231sd_fma(auVar15,auVar14,auVar41);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar6 * dVar5;
  auVar15 = vfmsub231sd_fma(auVar12,auVar11,auVar41);
  auVar15 = vfnmadd231sd_fma(auVar15,auVar33,auVar47);
  auVar15 = vfmadd231sd_fma(auVar15,auVar14,auVar51);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar5 * dVar1;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar8;
  auVar14 = vfmsub231sd_fma(auVar23,auVar11,auVar48);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar7;
  auVar14 = vfmadd231sd_fma(auVar14,auVar33,auVar42);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar3;
  auVar13 = vfnmadd231sd_fma(auVar14,auVar45,auVar52);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar8 * dVar1;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar5;
  auVar14 = vfmadd231sd_fma(auVar26,auVar11,auVar29);
  auVar14 = vfmadd231sd_fma(auVar14,auVar45,auVar42);
  auVar14 = vfmadd231sd_fma(auVar14,auVar33,auVar52);
  (local->coord_dt).rot.m_data[0] = auVar14._0_8_;
  (local->coord_dt).rot.m_data[1] = auVar13._0_8_;
  (local->coord_dt).rot.m_data[2] = auVar15._0_8_;
  (local->coord_dt).rot.m_data[3] = auVar16._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[0];
  dVar1 = (this->super_ChFrame<double>).coord.rot.m_data[1];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1;
  dVar2 = (this->coord_dtdt).rot.m_data[1];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar2;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = (local->super_ChFrame<double>).coord.rot.m_data[3];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = (this->coord_dtdt).rot.m_data[3];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = (this->coord_dtdt).rot.m_data[0];
  dVar3 = (local->super_ChFrame<double>).coord.rot.m_data[1];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar3;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = (local->super_ChFrame<double>).coord.rot.m_data[2];
  dVar5 = (this->coord_dtdt).rot.m_data[2];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar5;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar5 * dVar4;
  auVar11 = vfmadd231sd_fma(auVar34,auVar46,auVar49);
  auVar11 = vfmadd231sd_fma(auVar11,auVar39,auVar53);
  auVar11 = vfnmadd231sd_fma(auVar11,auVar43,auVar37);
  dVar4 = (this->coord_dt).rot.m_data[1];
  dVar5 = (this->coord_dt).rot.m_data[3];
  dVar6 = (this->coord_dt).rot.m_data[0];
  dVar7 = (this->coord_dt).rot.m_data[2];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar7;
  auVar10 = vmulsd_avx512f(auVar14,auVar62);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar6;
  auVar10 = vfmadd231sd_avx512f(auVar10,auVar60,auVar15);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar5;
  auVar10 = vfmadd231sd_avx512f(auVar10,auVar58,auVar13);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar4;
  auVar10 = vfnmadd231sd_avx512f(auVar10,auVar56,auVar16);
  dVar9 = ((parent->coord_dtdt).rot.m_data[2] - auVar11._0_8_) - (auVar10._0_8_ + auVar10._0_8_);
  dVar8 = (this->super_ChFrame<double>).coord.rot.m_data[2];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar8;
  auVar11 = vmulsd_avx512f(auVar17,auVar43);
  auVar11 = vfmadd231sd_avx512f(auVar11,auVar46,auVar53);
  auVar11 = vfnmadd231sd_avx512f(auVar11,auVar39,auVar49);
  auVar11 = vfmadd231sd_avx512f(auVar11,auVar55,auVar37);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = (parent->coord_dtdt).rot.m_data[1];
  auVar11 = vsubsd_avx512f(auVar65,auVar11);
  auVar10 = vmulsd_avx512f(auVar56,auVar14);
  auVar10 = vfmadd231sd_avx512f(auVar10,auVar60,auVar13);
  auVar10 = vfnmadd231sd_avx512f(auVar10,auVar58,auVar15);
  auVar10 = vfmadd231sd_avx512f(auVar10,auVar62,auVar16);
  auVar10 = vaddsd_avx512f(auVar10,auVar10);
  auVar10 = vsubsd_avx512f(auVar11,auVar10);
  auVar11 = vmulsd_avx512f(auVar17,auVar39);
  auVar11 = vfmadd231sd_avx512f(auVar11,auVar46,auVar37);
  auVar11 = vfnmadd231sd_avx512f(auVar11,auVar55,auVar53);
  auVar11 = vfmadd231sd_avx512f(auVar11,auVar43,auVar49);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = (parent->coord_dtdt).rot.m_data[3];
  auVar11 = vsubsd_avx512f(auVar66,auVar11);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar5;
  auVar12 = vmulsd_avx512f(auVar59,auVar14);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar6;
  auVar12 = vfmadd231sd_avx512f(auVar12,auVar61,auVar16);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar7;
  auVar12 = vfnmadd231sd_avx512f(auVar12,auVar63,auVar13);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar4;
  auVar12 = vfmadd231sd_avx512f(auVar12,auVar57,auVar15);
  auVar12 = vaddsd_avx512f(auVar12,auVar12);
  auVar12 = vsubsd_avx512f(auVar11,auVar12);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar3 * dVar2;
  auVar11 = vfmsub231sd_fma(auVar44,auVar46,auVar17);
  auVar11 = vfnmadd231sd_fma(auVar11,auVar55,auVar49);
  auVar11 = vfnmadd231sd_fma(auVar11,auVar39,auVar37);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = (parent->coord_dtdt).rot.m_data[0];
  auVar11 = vsubsd_avx512f(auVar64,auVar11);
  auVar13 = vmulsd_avx512f(auVar13,auVar57);
  auVar14 = vfmsub231sd_avx512f(auVar13,auVar61,auVar14);
  auVar15 = vfnmadd231sd_avx512f(auVar14,auVar63,auVar15);
  auVar15 = vfnmadd231sd_avx512f(auVar15,auVar59,auVar16);
  dVar3 = auVar11._0_8_ - (auVar15._0_8_ + auVar15._0_8_);
  dVar2 = (this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar3 * dVar2;
  auVar15 = vfmsub231sd_avx512f(auVar21,auVar19,auVar12);
  auVar15 = vfmadd231sd_avx512f(auVar15,auVar35,auVar10);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar9;
  auVar14 = vfnmadd231sd_fma(auVar15,auVar20,auVar30);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar8 * dVar3;
  auVar15 = vfmsub231sd_fma(auVar24,auVar19,auVar30);
  auVar15 = vfnmadd231sd_avx512f(auVar15,auVar18,auVar10);
  auVar11 = vfmadd231sd_avx512f(auVar15,auVar20,auVar12);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar3 * dVar1;
  auVar15 = vfmsub231sd_avx512f(auVar27,auVar19,auVar10);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar9;
  auVar15 = vfmadd231sd_fma(auVar15,auVar18,auVar31);
  auVar16 = vfnmadd231sd_avx512f(auVar15,auVar35,auVar12);
  auVar15 = vmulsd_avx512f(auVar20,auVar10);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar3;
  auVar15 = vfmadd231sd_fma(auVar15,auVar19,auVar13);
  auVar15 = vfmadd231sd_fma(auVar15,auVar35,auVar31);
  auVar15 = vfmadd231sd_avx512f(auVar15,auVar18,auVar12);
  (local->coord_dtdt).rot.m_data[0] = auVar15._0_8_;
  (local->coord_dtdt).rot.m_data[1] = auVar16._0_8_;
  (local->coord_dtdt).rot.m_data[2] = auVar11._0_8_;
  (local->coord_dtdt).rot.m_data[3] = auVar14._0_8_;
  return;
}

Assistant:

void TransformParentToLocal(
        const ChFrameMoving<Real>& parent,  ///< frame to transform, given in parent coordinates
        ChFrameMoving<Real>& local          ///< transformed frame, in local coordinates, will be stored here
    ) const {
        // pos & rot
        ChFrame<Real>::TransformParentToLocal(parent, local);

        // pos_dt
        local.coord_dt.pos = PointSpeedParentToLocal(parent.coord.pos, parent.coord_dt.pos);

        // pos_dtdt
        local.coord_dtdt.pos =
            PointAccelerationParentToLocal(parent.coord.pos, parent.coord_dt.pos, parent.coord_dtdt.pos);

        // rot_dt
        local.coord_dt.rot = this->coord.rot.GetConjugate() % (parent.coord_dt.rot - coord_dt.rot % local.coord.rot);

        // rot_dtdt
        local.coord_dtdt.rot =
            this->coord.rot.GetConjugate() %
            (parent.coord_dtdt.rot - coord_dtdt.rot % local.coord.rot - (coord_dt.rot % local.coord_dt.rot) * 2);
    }